

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O3

void __thiscall
cfd::js::api::json::UpdateTxOutAmountData::ConvertFromStruct
          (UpdateTxOutAmountData *this,UpdateTxOutAmountDataStruct *data)

{
  this->amount_ = data->amount;
  this->index_ = data->index;
  std::__cxx11::string::_M_assign((string *)&this->address_);
  std::__cxx11::string::_M_assign((string *)&this->direct_locking_script_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void UpdateTxOutAmountData::ConvertFromStruct(
    const UpdateTxOutAmountDataStruct& data) {
  amount_ = data.amount;
  index_ = data.index;
  address_ = data.address;
  direct_locking_script_ = data.direct_locking_script;
  ignore_items = data.ignore_items;
}